

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

bool miniminer_tests::sanity_check
               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *transactions,
               map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *bumpfees)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  shared_ptr<const_CTransaction> *psVar3;
  pointer psVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  pointer pCVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var11;
  element_type *peVar12;
  pointer pCVar13;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  pointer psVar14;
  long lVar15;
  long in_FS_OFFSET;
  key_type local_98;
  COutPoint outpoint_;
  undefined4 uStack_44;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var6 = (bumpfees->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(bumpfees->_M_t)._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      psVar4 = (transactions->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar14 = (transactions->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar4;
          psVar14 = psVar14 + 1) {
        peVar12 = (psVar14->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        pCVar13 = (peVar12->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar8 = (peVar12->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (1 < (ulong)(((long)pCVar8 - (long)pCVar13) / 0x28)) {
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
               outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ &
               0xffffffff00000000;
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
               outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8;
          unique0x10000769 =
               (uchar *)outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
          for (uVar10 = 0; uVar10 < (ulong)(((long)pCVar8 - (long)pCVar13) / 0x28);
              uVar10 = uVar10 + 1) {
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(peVar12->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((long)(peVar12->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((long)(peVar12->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  ((long)(peVar12->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            local_98.n = (uint32_t)uVar10;
            cVar7 = std::
                    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    ::find(&bumpfees->_M_t,&local_98);
            if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
              std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_unique<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)&outpoint_,(long *)&cVar7._M_node[2]._M_parent);
            }
            peVar12 = (psVar14->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            pCVar13 = (peVar12->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pCVar8 = (peVar12->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                     *)&outpoint_);
        }
      }
      bVar5 = true;
LAB_0039db6e:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return bVar5;
      }
      __stack_chk_fail();
    }
    if ((long)p_Var6[2]._M_parent < 0) {
LAB_0039da77:
      bVar5 = false;
      goto LAB_0039db6e;
    }
    if (p_Var6[2]._M_parent != (_Base_ptr)0x0) {
      stack0xffffffffffffffb8 = (uchar *)CONCAT44(uStack_44,p_Var6[2]._M_color);
      outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(p_Var6 + 1);
      outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = p_Var6[1]._M_parent;
      outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = p_Var6[1]._M_left;
      outpoint_.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = p_Var6[1]._M_right;
      __it._M_current =
           (transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      psVar3 = (transactions->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &outpoint_;
      lVar9 = (long)psVar3 - (long)__it._M_current;
      for (lVar15 = lVar9 >> 6; _Var11._M_current = __it._M_current, 0 < lVar15;
          lVar15 = lVar15 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it);
        if (bVar5) goto LAB_0039da2b;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it._M_current + 1);
        _Var11._M_current = __it._M_current + 1;
        if (bVar5) goto LAB_0039da2b;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it._M_current + 2);
        _Var11._M_current = __it._M_current + 2;
        if (bVar5) goto LAB_0039da2b;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it._M_current + 3);
        _Var11._M_current = __it._M_current + 3;
        if (bVar5) goto LAB_0039da2b;
        __it._M_current = __it._M_current + 4;
        lVar9 = lVar9 + -0x40;
      }
      lVar9 = lVar9 >> 4;
      if (lVar9 == 1) {
LAB_0039da61:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it);
        _Var11._M_current = __it._M_current;
        if (!bVar5) {
          _Var11._M_current = psVar3;
        }
      }
      else if (lVar9 == 2) {
LAB_0039da4a:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it);
        _Var11._M_current = __it._M_current;
        if (!bVar5) {
          __it._M_current = __it._M_current + 1;
          goto LAB_0039da61;
        }
      }
      else {
        if (lVar9 != 3) goto LAB_0039da77;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                              *)&local_98,__it);
        if (!bVar5) {
          __it._M_current = __it._M_current + 1;
          goto LAB_0039da4a;
        }
      }
LAB_0039da2b:
      if (_Var11._M_current == psVar3) goto LAB_0039da77;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

static inline bool sanity_check(const std::vector<CTransactionRef>& transactions,
                                const std::map<COutPoint, CAmount>& bumpfees)
{
    // No negative bumpfees.
    for (const auto& [outpoint, fee] : bumpfees) {
        if (fee < 0) return false;
        if (fee == 0) continue;
        auto outpoint_ = outpoint; // structured bindings can't be captured in C++17, so we need to use a variable
        const bool found = std::any_of(transactions.cbegin(), transactions.cend(), [&](const auto& tx) {
            return outpoint_.hash == tx->GetHash() && outpoint_.n < tx->vout.size();
        });
        if (!found) return false;
    }
    for (const auto& tx : transactions) {
        // If tx has multiple outputs, they must all have the same bumpfee (if they exist).
        if (tx->vout.size() > 1) {
            std::set<CAmount> distinct_bumpfees;
            for (size_t i{0}; i < tx->vout.size(); ++i) {
                const auto bumpfee = bumpfees.find(COutPoint{tx->GetHash(), static_cast<uint32_t>(i)});
                if (bumpfee != bumpfees.end()) distinct_bumpfees.insert(bumpfee->second);
            }
            if (distinct_bumpfees.size() > 1) return false;
        }
    }
    return true;
}